

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

UnicodeString * icu_63::ICUServiceKey::parseSuffix(UnicodeString *result)

{
  short sVar1;
  ushort uVar2;
  ushort uVar3;
  int32_t iVar4;
  
  sVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (result->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  iVar4 = UnicodeString::doIndexOf(result,L'/',0,iVar4);
  if (-1 < iVar4) {
    if (iVar4 + 1 == 0x7fffffff) {
      uVar2 = (result->fUnion).fStackFields.fLengthAndFlags;
      uVar3 = 2;
      if ((uVar2 & 1) == 0) {
        uVar3 = uVar2 & 0x1e;
      }
      (result->fUnion).fStackFields.fLengthAndFlags = uVar3;
    }
    else {
      UnicodeString::doReplace(result,0,iVar4 + 1,(UChar *)0x0,0,0);
    }
  }
  return result;
}

Assistant:

UnicodeString& 
ICUServiceKey::parseSuffix(UnicodeString& result) 
{
    int32_t n = result.indexOf(PREFIX_DELIMITER);
    if (n >= 0) {
        result.remove(0, n+1);
    }
    return result;
}